

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QGraphicsItemAnimationPrivate::Pair>::begin(QList<QGraphicsItemAnimationPrivate::Pair> *this)

{
  Pair *n;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62b09);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::operator->(in_RDI);
  n = QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::begin
                ((QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)0xa62b1a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }